

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  int *ldata_00;
  ValidityMask *rdata_00;
  SelectionVector *in_RCX;
  VectorType in_DL;
  ulong in_RSI;
  ulong in_RDI;
  byte in_R8B;
  int *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  SelectionVector *lsel;
  ValidityMask *in_stack_ffffffffffffff30;
  ValidityMask *in_stack_ffffffffffffff38;
  ValidityMask *rvalidity;
  ValidityMask *in_stack_ffffffffffffff40;
  UnifiedVectorFormat local_b8 [56];
  UnifiedVectorFormat local_80 [7];
  undefined1 uStack_79;
  SelectionVector local_70 [2];
  byte local_31;
  SelectionVector *local_30;
  VectorType local_28;
  ulong local_20;
  ulong local_18;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_28 = in_DL;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  duckdb::Vector::ToUnifiedFormat(local_18,(UnifiedVectorFormat *)local_30);
  duckdb::Vector::ToUnifiedFormat(local_20,(UnifiedVectorFormat *)local_30);
  duckdb::Vector::SetVectorType(local_28);
  ldata_00 = FlatVector::GetData<int>((Vector *)0xe808ad);
  UnifiedVectorFormat::GetData<int>(local_80);
  UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  lsel = local_70;
  this = local_b8;
  rvalidity = in_stack_ffffffffffffff38;
  rdata_00 = FlatVector::Validity((Vector *)0xe8092e);
  ExecuteGenericLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool>
            (ldata_00,(int *)rdata_00,(int *)this,lsel,local_30,(idx_t)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30,rvalidity,in_stack_ffffffffffffff40,(bool)uStack_79);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}